

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

void __thiscall
helix::order_book::order_book(order_book *this,string *symbol,uint64_t timestamp,size_t max_orders)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  float fVar6;
  
  paVar1 = &(this->_symbol).field_2;
  (this->_symbol)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (symbol->_M_dataplus)._M_p;
  paVar2 = &symbol->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&symbol->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_symbol).field_2 + 8) = uVar5;
  }
  else {
    (this->_symbol)._M_dataplus._M_p = pcVar4;
    (this->_symbol).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_symbol)._M_string_length = symbol->_M_string_length;
  (symbol->_M_dataplus)._M_p = (pointer)paVar2;
  symbol->_M_string_length = 0;
  (symbol->field_2)._M_local_buf[0] = '\0';
  this->_timestamp = timestamp;
  this->_state = unknown;
  boost::multi_index::
  multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
  ::multi_index_container(&this->_orders);
  p_Var3 = &(this->_bids)._M_t._M_impl.super__Rb_tree_header;
  (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->_bids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fVar6 = ceilf((float)max_orders / (this->_orders).super_type.mlf);
  boost::multi_index::detail::
  hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  ::rehash(&(this->_orders).super_type,
           (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6);
  return;
}

Assistant:

order_book::order_book(std::string symbol, uint64_t timestamp, size_t max_orders)
    : _symbol{std::move(symbol)}
    , _timestamp{timestamp}
    , _state{trading_state::unknown}
{
#if BOOST_VERSION >= 105600
    _orders.reserve(max_orders);
#endif
}